

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O0

void __thiscall
PDFUsedFont::PDFUsedFont
          (PDFUsedFont *this,FT_Face inInputFace,string *inFontFilePath,
          string *inAdditionalMetricsFontFilePath,long inFontIndex,ObjectsContext *inObjectsContext,
          bool inEmbedFont)

{
  bool inEmbedFont_local;
  ObjectsContext *inObjectsContext_local;
  long inFontIndex_local;
  string *inAdditionalMetricsFontFilePath_local;
  string *inFontFilePath_local;
  FT_Face inInputFace_local;
  PDFUsedFont *this_local;
  
  this->_vptr_PDFUsedFont = (_func_int **)&PTR__PDFUsedFont_0054f288;
  FreeTypeFaceWrapper::FreeTypeFaceWrapper
            (&this->mFaceWrapper,inInputFace,inFontFilePath,inAdditionalMetricsFontFilePath,
             inFontIndex,true);
  std::
  map<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
  ::map(&this->mAdvanceCache);
  this->mObjectsContext = inObjectsContext;
  this->mWrittenFont = (IWrittenFont *)0x0;
  this->mEmbedFont = inEmbedFont;
  return;
}

Assistant:

PDFUsedFont::PDFUsedFont(FT_Face inInputFace,
						 const std::string& inFontFilePath,
						 const std::string& inAdditionalMetricsFontFilePath,
                         long inFontIndex,
						 ObjectsContext* inObjectsContext,
						 bool inEmbedFont):mFaceWrapper(inInputFace,inFontFilePath,inAdditionalMetricsFontFilePath,inFontIndex)
{
	mObjectsContext = inObjectsContext;
	mWrittenFont = NULL;
	mEmbedFont = inEmbedFont;
}